

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

bool __thiscall
slang::ast::InstanceBodySymbol::hasSameType(InstanceBodySymbol *this,InstanceBodySymbol *other)

{
  SymbolKind SVar1;
  ParameterSymbol *this_00;
  ParameterSymbol *this_01;
  bool bVar2;
  size_t sVar3;
  ConstantValue *lhs;
  ConstantValue *rhs;
  Type *this_02;
  Type *rhs_00;
  pointer ppPVar4;
  pointer ppPVar5;
  pointer ppPVar6;
  bool bVar7;
  
  if (other == this) {
    bVar7 = true;
  }
  else if ((this->definition == other->definition) &&
          (sVar3 = (this->parameters)._M_extent._M_extent_value,
          sVar3 == (other->parameters)._M_extent._M_extent_value)) {
    ppPVar5 = (other->parameters)._M_ptr;
    ppPVar4 = (this->parameters)._M_ptr;
    for (ppPVar6 = ppPVar4; bVar7 = ppPVar6 == ppPVar4 + sVar3, !bVar7; ppPVar6 = ppPVar6 + 1) {
      this_00 = (ParameterSymbol *)(*ppPVar6)->symbol;
      this_01 = (ParameterSymbol *)(*ppPVar5)->symbol;
      SVar1 = (this_00->super_ValueSymbol).super_Symbol.kind;
      if (SVar1 != (this_01->super_ValueSymbol).super_Symbol.kind) {
        return bVar7;
      }
      if (SVar1 == Parameter) {
        lhs = ParameterSymbol::getValue(this_00,(SourceRange)ZEXT816(0));
        rhs = ParameterSymbol::getValue(this_01,(SourceRange)ZEXT816(0));
        bVar2 = slang::operator==(lhs,rhs);
      }
      else {
        this_02 = DeclaredType::getType
                            ((DeclaredType *)&(this_00->super_ValueSymbol).declaredType.dimensions);
        rhs_00 = DeclaredType::getType
                           ((DeclaredType *)&(this_01->super_ValueSymbol).declaredType.dimensions);
        bVar2 = Type::isMatching(this_02,rhs_00);
      }
      if (bVar2 == false) {
        return bVar7;
      }
      ppPVar5 = ppPVar5 + 1;
      ppPVar4 = (this->parameters)._M_ptr;
      sVar3 = (this->parameters)._M_extent._M_extent_value;
    }
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool InstanceBodySymbol::hasSameType(const InstanceBodySymbol& other) const {
    if (&other == this)
        return true;

    if (&definition != &other.definition)
        return false;

    if (parameters.size() != other.parameters.size())
        return false;

    for (auto li = parameters.begin(), ri = other.parameters.begin(); li != parameters.end();
         li++, ri++) {

        auto& lp = (*li)->symbol;
        auto& rp = (*ri)->symbol;
        if (lp.kind != rp.kind)
            return false;

        if (lp.kind == SymbolKind::Parameter) {
            auto& lv = lp.as<ParameterSymbol>().getValue();
            auto& rv = rp.as<ParameterSymbol>().getValue();
            if (lv != rv)
                return false;
        }
        else {
            auto& lt = lp.as<TypeParameterSymbol>().targetType.getType();
            auto& rt = rp.as<TypeParameterSymbol>().targetType.getType();
            if (!lt.isMatching(rt))
                return false;
        }
    }

    return true;
}